

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

BeliefUpperBound * __thiscall despot::BaseTag::CreateBeliefUpperBound(BaseTag *this,string *name)

{
  bool bVar1;
  MDPUpperBound *this_00;
  TagManhattanUpperBound *this_01;
  ostream *poVar2;
  BaseTag *local_70;
  BaseTag *local_60;
  string *name_local;
  BaseTag *this_local;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_local = (BaseTag *)operator_new(0x10);
    despot::TrivialBeliefUpperBound::TrivialBeliefUpperBound
              ((TrivialBeliefUpperBound *)this_local,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    bVar1 = std::operator==(name,"DEFAULT");
    if ((bVar1) || (bVar1 = std::operator==(name,"MDP"), bVar1)) {
      this_00 = (MDPUpperBound *)operator_new(0x38);
      despot::MDPUpperBound::MDPUpperBound(this_00,&this->super_MDP,&this->super_StateIndexer);
      local_60 = (BaseTag *)0x0;
      if (this_00 != (MDPUpperBound *)0x0) {
        local_60 = (BaseTag *)(this_00 + 8);
      }
      this_local = local_60;
    }
    else {
      bVar1 = std::operator==(name,"MANHATTAN");
      if (!bVar1) {
        bVar1 = std::operator!=(name,"print");
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported belief upper bound: ");
          poVar2 = std::operator<<(poVar2,(string *)name);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Supported types: TRIVIAL, MDP, MANHATTAN (default to MDP)");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      this_01 = (TagManhattanUpperBound *)operator_new(0x30);
      TagManhattanUpperBound::TagManhattanUpperBound(this_01,this);
      local_70 = (BaseTag *)0x0;
      if (this_01 != (TagManhattanUpperBound *)0x0) {
        local_70 = (BaseTag *)&this_01->super_BeliefUpperBound;
      }
      this_local = local_70;
    }
  }
  return (BeliefUpperBound *)this_local;
}

Assistant:

BeliefUpperBound* BaseTag::CreateBeliefUpperBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefUpperBound(this);
	} else if (name == "DEFAULT" || name == "MDP") {
		return new MDPUpperBound(this, *this);
	} else if (name == "MANHATTAN") {
		return new TagManhattanUpperBound(this);
	} else {
		if (name != "print")
			cerr << "Unsupported belief upper bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, MDP, MANHATTAN (default to MDP)" << endl;
		exit(1);
		return NULL;
	}
}